

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O2

void __thiscall
deqp::egl::Image::UnsupportedImageSource::~UnsupportedImageSource(UnsupportedImageSource *this)

{
  ~UnsupportedImageSource(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

UnsupportedImageSource	(const string& message, GLenum format) : m_message(message), m_format(format) {}